

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-host.c
# Opt level: O1

int wpe_renderer_host_create_client(void)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 auVar2 [16];
  
  auVar2._8_8_ = in_RDX;
  auVar2._0_8_ = DAT_0010b2b9;
  if (wpe_renderer_host_create_client_s_renderer_host_init == '\0') {
    wpe_renderer_host_create_client_s_renderer_host_body = (undefined8 *)0x0;
    DAT_0010b2b9 = 0;
    wpe_renderer_host_create_client_s_renderer_host_init = '\x01';
    wpe_renderer_host_create_client_s_renderer_host_body =
         (undefined8 *)wpe_load_object("_wpe_renderer_host_interface");
    auVar2 = (*(code *)*wpe_renderer_host_create_client_s_renderer_host_body)();
  }
  DAT_0010b2b9 = auVar2._0_8_;
  iVar1 = (*(code *)wpe_renderer_host_create_client_s_renderer_host_body[2])
                    (DAT_0010b2b9,in_RSI,auVar2._8_8_,in_RAX);
  return iVar1;
}

Assistant:

int
wpe_renderer_host_create_client()
{
    static struct wpe_renderer_host* s_renderer_host = 0;
    if (!s_renderer_host) {
        s_renderer_host = wpe_calloc(1, sizeof(struct wpe_renderer_host));
        s_renderer_host->base.interface = wpe_load_object("_wpe_renderer_host_interface");
        s_renderer_host->base.interface_data = s_renderer_host->base.interface->create();

        // FIXME: atexit() should clean up the object.
    }

    return s_renderer_host->base.interface->create_client(s_renderer_host->base.interface_data);
}